

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

void Gia_ManArePrintCube(Gia_ManAre_t *p,Gia_StaAre_t *pSta)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  uVar5 = 0;
  printf("%4d %4d :  ",(ulong)(uint)p->iStaCur,(ulong)(p->nStas - 1));
  printf("Prev %4d   ",(ulong)((uint)pSta->iPrev & 0x7fffffff));
  printf("%p   ",pSta);
  pGVar3 = p->pAig;
  iVar4 = pGVar3->nRegs;
  uVar7 = 0;
  uVar1 = 0;
  if (0 < iVar4) {
    uVar8 = 0;
    uVar1 = 0;
    uVar7 = 0;
    uVar5 = 0;
    iVar9 = 0;
    do {
      iVar2 = pGVar3->vCos->nSize;
      uVar6 = (iVar2 - iVar4) + iVar9;
      if (((int)uVar6 < 0) || (iVar2 <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pGVar3->vCos->pArray[uVar6];
      if ((iVar4 < 0) || (pGVar3->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
      if (((uint)(&pSta[1].iPrev)[(int)uVar8 >> 5] >> (uVar8 & 0x1e) & 1) == 0) {
        if (((uint)(&pSta[1].iPrev)[(int)uVar8 >> 5] >> (sbyte)(uVar8 & 0x1e) & 2) == 0) {
          putchar(0x2d);
          uVar1 = uVar1 + 1;
        }
        else {
          putchar(0x31);
          uVar7 = uVar7 + 1;
        }
      }
      else {
        putchar(0x30);
        uVar5 = uVar5 + 1;
      }
      iVar9 = iVar9 + 1;
      pGVar3 = p->pAig;
      iVar4 = pGVar3->nRegs;
      uVar8 = uVar8 + 2;
    } while (iVar9 < iVar4);
  }
  printf("  0 =%3d",(ulong)uVar5);
  printf("  1 =%3d",(ulong)uVar7);
  printf("  - =%3d",(ulong)uVar1);
  putchar(10);
  return;
}

Assistant:

void Gia_ManArePrintCube( Gia_ManAre_t * p, Gia_StaAre_t * pSta )
{
    Gia_Obj_t * pObj;
    int i, Count0 = 0, Count1 = 0, Count2 = 0;
    printf( "%4d %4d :  ", p->iStaCur, p->nStas-1 );
    printf( "Prev %4d   ", Gia_Ptr2Int(pSta->iPrev) );
    printf( "%p   ", pSta );
    Gia_ManForEachRi( p->pAig, pObj, i )
    {
        if ( Gia_StaHasValue0(pSta, i) )
            printf( "0" ), Count0++;
        else if ( Gia_StaHasValue1(pSta, i) )
            printf( "1" ), Count1++;
        else
            printf( "-" ), Count2++;
    }
    printf( "  0 =%3d", Count0 );
    printf( "  1 =%3d", Count1 );
    printf( "  - =%3d", Count2 );
    printf( "\n" );
}